

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O3

void * zexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  ulong uVar1;
  undefined8 *puVar2;
  int iVar3;
  ExpHeader *pEVar4;
  char *src;
  void *old;
  undefined8 uVar5;
  int iVar6;
  int_t *piVar7;
  sbyte sVar8;
  int iVar9;
  MemType MVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  doublecomplex *dnew;
  float fVar16;
  float local_3c;
  
  pEVar4 = Glu->expanders;
  iVar6 = *prev_len;
  iVar15 = (int)((float)iVar6 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar15 = iVar6;
  }
  if (keep_prev != 0) {
    iVar15 = iVar6;
  }
  MVar10 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    sVar8 = (MVar10 != LSUB) * '\x02' + 2;
    pvVar13 = superlu_malloc((long)iVar15 << sVar8);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        if (pvVar13 == (void *)0x0) {
          local_3c = 1.5;
          iVar6 = 0xb;
          do {
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              return (void *)0x0;
            }
            local_3c = (local_3c + 1.0) * 0.5;
            iVar15 = (int)((float)*prev_len * local_3c);
            pvVar13 = superlu_malloc((long)iVar15 << sVar8);
          } while (pvVar13 == (void *)0x0);
        }
      }
      else if (pvVar13 == (void *)0x0) {
        return (void *)0x0;
      }
      old = pEVar4[type].mem;
      if (MVar10 == LSUB) {
        copy_mem_int(len_to_copy,old,pvVar13);
      }
      else if (0 < len_to_copy) {
        lVar12 = 0;
        do {
          puVar2 = (undefined8 *)((long)old + lVar12);
          uVar5 = puVar2[1];
          *(undefined8 *)((long)pvVar13 + lVar12) = *puVar2;
          ((undefined8 *)((long)pvVar13 + lVar12))[1] = uVar5;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(uint)len_to_copy << 4 != lVar12);
      }
      superlu_free(pEVar4[type].mem);
    }
    pEVar4[type].mem = pvVar13;
  }
  else if (Glu->num_expansions == 0) {
    iVar14 = iVar15 << (MVar10 != LSUB) * '\x02' + 2;
    iVar9 = (Glu->stack).used;
    iVar6 = iVar9 + iVar14;
    if (iVar6 < (Glu->stack).size) {
      iVar9 = (Glu->stack).top1;
      pvVar13 = (void *)((long)iVar9 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar14 + iVar9;
      (Glu->stack).used = iVar6;
      iVar9 = iVar6;
    }
    else {
      pvVar13 = (void *)0x0;
    }
    if ((type < LSUB) && (iVar6 = (int)pvVar13, ((ulong)pvVar13 & 7) != 0)) {
      uVar1 = (long)pvVar13 + 7;
      pvVar13 = (void *)(uVar1 & 0xfffffffffffffff8);
      iVar6 = ((uint)uVar1 & 0xfffffff8) - iVar6;
      piVar7 = &(Glu->stack).top1;
      *piVar7 = *piVar7 + iVar6;
      (Glu->stack).used = iVar9 + iVar6;
    }
    pEVar4[type].mem = pvVar13;
  }
  else {
    sVar8 = (MVar10 != LSUB) * '\x02' + 2;
    iVar14 = iVar15 - iVar6 << sVar8;
    iVar9 = (Glu->stack).used;
    if (keep_prev == 0) {
      iVar3 = (Glu->stack).size;
      if (iVar3 <= iVar9 + iVar14) {
        fVar16 = 1.5;
        iVar11 = 0xb;
        do {
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            return (void *)0x0;
          }
          fVar16 = (fVar16 + 1.0) * 0.5;
          iVar15 = (int)(fVar16 * (float)iVar6);
          iVar14 = iVar15 - iVar6 << sVar8;
        } while (iVar3 <= iVar9 + iVar14);
      }
    }
    else if ((Glu->stack).size <= iVar9 + iVar14) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar4[type + UCOL].mem;
      lVar12 = (long)iVar14;
      user_bcopy(src,src + lVar12,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar7 = (int_t *)((long)pEVar4[3].mem + lVar12);
        pEVar4[3].mem = piVar7;
        Glu->usub = piVar7;
        if (type != LSUB) {
          piVar7 = (int_t *)((long)pEVar4[2].mem + lVar12);
          pEVar4[2].mem = piVar7;
          Glu->lsub = piVar7;
          if (type == LUSUP) {
            pvVar13 = (void *)(lVar12 + (long)pEVar4[1].mem);
            pEVar4[1].mem = pvVar13;
            Glu->ucol = pvVar13;
          }
        }
      }
      iVar6 = (Glu->stack).top1 + iVar14;
      (Glu->stack).top1 = iVar6;
      iVar9 = (Glu->stack).used + iVar14;
      (Glu->stack).used = iVar9;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar6 + iVar14;
        (Glu->stack).used = iVar9 + iVar14;
      }
    }
  }
  pEVar4[type].size = iVar15;
  *prev_len = iVar15;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar4[type].mem;
}

Assistant:

void
*zexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(doublecomplex);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_doublecomplex(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = zuser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}